

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::rehash
          (HashIndex<kj::_::HashSetCallbacks> *this,size_t targetSize)

{
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> AStack_28;
  
  oldBuckets.size_ = targetSize;
  oldBuckets.ptr = (HashBucket *)(this->buckets).size_;
  _::rehash(&AStack_28,(_ *)(this->buckets).ptr,oldBuckets,in_R8);
  Array<kj::_::HashBucket>::operator=(&this->buckets,&AStack_28);
  Array<kj::_::HashBucket>::~Array(&AStack_28);
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
  }